

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

IF97BACKREGIONS IF97::RegionDetermination_HS(double h,double s)

{
  IF97BACKREGIONS IVar1;
  int iVar2;
  out_of_range *this;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double ans;
  double dVar9;
  double sigma;
  
  if (RegionDetermination_HS(double,double)::b13 == '\0') {
    iVar2 = __cxa_guard_acquire(&RegionDetermination_HS(double,double)::b13);
    if (iVar2 != 0) {
      Backwards::Boundary13HS::Boundary13HS(&RegionDetermination_HS::b13);
      __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&RegionDetermination_HS::b13,
                   &__dso_handle);
      __cxa_guard_release(&RegionDetermination_HS(double,double)::b13);
    }
  }
  if (RegionDetermination_HS(double,double)::b23hs == '\0') {
    iVar2 = __cxa_guard_acquire(&RegionDetermination_HS(double,double)::b23hs);
    if (iVar2 != 0) {
      Backwards::BackwardsRegion::BackwardsRegion
                (&RegionDetermination_HS::b23hs.super_BackwardsRegion,
                 (BackwardRegionResidualElement *)Backwards::CoeffTb23HS,0x19);
      RegionDetermination_HS::b23hs.super_BackwardsRegion._vptr_BackwardsRegion =
           (_func_int **)&PTR_T_pX_00122c48;
      RegionDetermination_HS::b23hs.super_BackwardsRegion.h_star = 3000.0;
      RegionDetermination_HS::b23hs.super_BackwardsRegion.s_star = 5.3;
      RegionDetermination_HS::b23hs.super_BackwardsRegion.T_star = 900.0;
      RegionDetermination_HS::b23hs.super_BackwardsRegion.a = -0.727;
      RegionDetermination_HS::b23hs.super_BackwardsRegion.b = -0.864;
      __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&RegionDetermination_HS::b23hs,
                   &__dso_handle);
      __cxa_guard_release(&RegionDetermination_HS(double,double)::b23hs);
    }
  }
  if (RegionDetermination_HS(double,double)::R2c == '\0') {
    iVar2 = __cxa_guard_acquire(&RegionDetermination_HS(double,double)::R2c);
    if (iVar2 != 0) {
      Backwards::Region2cHS::Region2cHS(&RegionDetermination_HS::R2c);
      __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&RegionDetermination_HS::R2c,
                   &__dso_handle);
      __cxa_guard_release(&RegionDetermination_HS(double,double)::R2c);
    }
  }
  if ((s < 0.0) || (11.921054825051103 < s)) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Entropy out of range");
  }
  else {
    if (6.04048367171238 <= s) {
      dVar5 = *Hmax_n;
      dVar6 = log(s);
      uVar4 = 2;
      dVar7 = 1.0;
      dVar9 = s;
      do {
        if ((uVar4 & 1) != 0) {
          dVar7 = dVar7 * dVar9;
        }
        dVar9 = dVar9 * dVar9;
        uVar3 = (uint)uVar4;
        uVar4 = uVar4 >> 1;
      } while (1 < uVar3);
      dVar5 = Hmax_n[2] / dVar7 + dVar5 * dVar6 + Hmax_n[1] / s + Hmax_n[3];
    }
    else {
      dVar5 = RegionOutputBackward(100.0,s,IF97_SMASS,false,NONE);
      dVar5 = RegionOutput(IF97_HMASS,dVar5,100.0,NONE);
    }
    if (h <= dVar5) {
      if (9.155492076509681 <= s) {
        dVar5 = RegionOutputBackward(0.000611213,s,IF97_SMASS,false,NONE);
        dVar5 = RegionOutput(IF97_HMASS,dVar5,0.000611213,NONE);
      }
      else {
        dVar5 = ((s + 4.09187776773977e-07) * 2500.910436455413) / 9.155492485697458 +
                0.000516837786577998;
      }
      if (dVar5 <= h) {
        if (s <= 3.77828134) {
          dVar5 = Backwards::Hsat_s(s);
          IVar1 = BACK_4;
          if ((dVar5 <= h) && (IVar1 = BACK_1, 3.397782955 <= s)) {
            dVar5 = Backwards::BackwardsRegion::h_s
                              (&RegionDetermination_HS::b13.super_BackwardsRegion,s);
            IVar1 = (uint)(dVar5 <= h) << 2;
          }
        }
        else if (s <= 4.41202148223476) {
          dVar5 = Backwards::Hsat_s(s);
          IVar1 = (uint)(h < dVar5) * 2 + BACK_3A;
        }
        else if (s <= 5.048096828) {
          dVar5 = Backwards::Hsat_s(s);
          IVar1 = (h < dVar5) + BACK_3B;
        }
        else if (s <= 5.260578707) {
          dVar5 = Backwards::Hsat_s(s);
          IVar1 = BACK_4;
          if (((dVar5 <= h) && (IVar1 = BACK_3B, 2563.592004 <= h)) &&
             (IVar1 = BACK_2C, h <= 2812.942061)) {
            dVar7 = Backwards::BackwardsRegion::t_hs
                              (&RegionDetermination_HS::b23hs.super_BackwardsRegion,h,s);
            dVar5 = region23_n[1];
            dVar9 = *region23_n;
            dVar6 = region23_n[2];
            dVar8 = Backwards::BackwardsRegion::p_hs
                              (&RegionDetermination_HS::R2c.super_BackwardsRegion,h,s);
            IVar1 = (uint)(dVar6 * dVar7 * dVar7 + dVar5 * dVar7 + dVar9 < dVar8) * 2 + BACK_2C;
          }
        }
        else if (s <= 5.85) {
          dVar5 = Backwards::Hsat_s(s);
          IVar1 = (uint)(h < dVar5) * 3 + BACK_2C;
        }
        else {
          IVar1 = BACK_2A;
          if (s < 9.155492076509681) {
            dVar5 = Backwards::Hsat_s(s);
            IVar1 = BACK_4;
            if (dVar5 <= h) {
              dVar5 = Backwards::H2ab_s(s);
              IVar1 = (dVar5 < h) + BACK_2A;
            }
          }
        }
        return IVar1;
      }
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Enthalpy out of range");
  }
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline IF97BACKREGIONS RegionDetermination_HS(double h, double s){
        static Backwards::Boundary13HS b13;
        static Backwards::Boundary23HS b23hs;
        static Backwards::Region2cHS R2c;

        // Check Overall Boundaries
        if ( (s < Smin) || (s > Smax) ) 
            throw std::out_of_range("Entropy out of range");
        if ( (h > Hmax(s)) || (h < Hmin(s)) )
            throw std::out_of_range("Enthalpy out of range");

        // ============================================================================
        // Start at the low entropy curves and work our way up.
        // =================================== Region 1 Check =========================
        if (s <= SfT23){
            if (h < Backwards::Hsat_s(s))     //   If below Saturated Liquid Curve
                return BACK_4;                //       REGION 4
            else if (s < S13min)              //   If below H13 Curve
                return BACK_1;                //       REGION 1
            else {                            //   IF within H13 Curve (S13min < s < SfT23)
                if (h < b13.h_s(s))           //       below curve
                    return BACK_1;            //           REGION 1
                else                          //       above curve
                    return BACK_3A;           //           REGION 3 
                 }                            //
        } else if (s <= Scrit){  //========== Region 3a Check (S < Scrit) ==============
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Liquid Curve
                return BACK_4;                //      REGION 4
            else                              //  If above curve
                return BACK_3A;               //      REGION 3(a)
        } else if (s <= S23min){  //========== Region 3b Check            ==============
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Liquid Curve
                return BACK_4;                //      REGION 4
            else                              //  If above curve
                return BACK_3B;               //      REGION 3(a)
        } else if (s <= S23max){  //========== Region 3b/2c Check Along B23 Curve ======
            if (h < Backwards::Hsat_s(s))     //  if below Saturated Vapor Curve
                return BACK_4;                //      REGION 4
            else if (h < H23min)              //  if below bounding box
                return BACK_3B;               //      REGION 3(b)
            else if (h > H23max)              //  if above bounding box
                return BACK_2C;               //      REGION 2(c)
            else {                            //  Need to check TB23 Curve
                double TB23 = b23hs.t_hs(h,s);       //  Calc TB23(h,s)
                double PB23 = Region23_T(TB23);      //  Calc Corresponding PB23
                double P    = R2c.p_hs(h,s);         //  Calc P(h,s) using Region 2c
                if (P > PB23)                        //  Above B23 Curve
                    return BACK_3B;                  //      REGION 3(b)
                else                                 //  Below B23 Curve
                    return BACK_2C;                  //      REGION 2(c)
            } 
        } else if (s <= S2bc){   //========== Region 3b Check            ==============
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Liquid Curve
                return BACK_4;                //      REGION 4
            else                              //  If above curve
                return BACK_2C;               //      REGION 2(c)
        } else if (s < Sgtrip) { //========== Region 2a/2b (s > S2bc) above Sat. Curve ==
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Vapor Curve
                return BACK_4;                //      REGION_4
            else {                            //  If above Curve then
                if (h > Backwards::H2ab_s(s))   //      if h > h2ab(s) Curve (P=4 MPa)
                    return BACK_2B;             //          REGION 2(b)
                else                            //      if h < h2ab(s) Curve (P=4 MPa)
                    return BACK_2A;             //          REGION 2(a)
            }
        } else
            return BACK_2A;      //========== Region 2a fall thru ========================
    }